

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

void insert<16000u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char> *root,uchar **strings,size_t n)

{
  bool bVar1;
  reference ppvVar2;
  vector_block<unsigned_char_*,_128U> *pvVar3;
  size_t sVar4;
  TrieNode<unsigned_char> *pTVar5;
  undefined1 local_80 [32];
  vector_block<unsigned_char_*,_128U> *local_60;
  vector_block<unsigned_char_*,_128U> *bucket;
  array<void_*,_256UL> *local_48;
  TrieNode<unsigned_char> *node;
  size_t sStack_38;
  uchar c;
  size_t depth;
  uchar *str;
  size_t i;
  size_t n_local;
  uchar **strings_local;
  TrieNode<unsigned_char> *root_local;
  
  str = (uchar *)0x0;
  i = n;
  n_local = (size_t)strings;
  strings_local = (uchar **)root;
  do {
    if (i <= str) {
      return;
    }
    depth = *(undefined8 *)(n_local + (long)str * 8);
    sStack_38 = 0;
    node._7_1_ = get_char<unsigned_char>((uchar *)depth,0);
    local_48 = (array<void_*,_256UL> *)strings_local;
    while( true ) {
      std::bitset<256UL>::operator[]((bitset<256UL> *)&bucket,(size_t)(local_48 + 1));
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&bucket);
      std::bitset<256UL>::reference::~reference((reference *)&bucket);
      if (!bVar1) break;
      bVar1 = is_end<unsigned_char>(node._7_1_);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                      ,0xdf,
                      "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 16000U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      ppvVar2 = std::array<void_*,_256UL>::operator[](local_48,(ulong)node._7_1_);
      local_48 = (array<void_*,_256UL> *)*ppvVar2;
      sStack_38 = sStack_38 + 1;
      node._7_1_ = get_char<unsigned_char>((uchar *)depth,sStack_38);
    }
    ppvVar2 = std::array<void_*,_256UL>::operator[](local_48,(ulong)node._7_1_);
    local_60 = (vector_block<unsigned_char_*,_128U> *)*ppvVar2;
    if (local_60 == (vector_block<unsigned_char_*,_128U> *)0x0) {
      pvVar3 = (vector_block<unsigned_char_*,_128U> *)operator_new(0x28);
      vector_block<unsigned_char_*,_128U>::vector_block(pvVar3);
      local_60 = pvVar3;
      ppvVar2 = std::array<void_*,_256UL>::operator[](local_48,(ulong)node._7_1_);
      *ppvVar2 = pvVar3;
    }
    vector_block<unsigned_char_*,_128U>::push_back(local_60,(uchar **)&depth);
    bVar1 = is_end<unsigned_char>(node._7_1_);
    if ((!bVar1) && (sVar4 = vector_block<unsigned_char_*,_128U>::size(local_60), 16000 < sVar4)) {
      pTVar5 = BurstSimple<unsigned_char>::operator()
                         ((BurstSimple<unsigned_char> *)(local_80 + 0x13),local_60,sStack_38 + 1);
      ppvVar2 = std::array<void_*,_256UL>::operator[](local_48,(ulong)node._7_1_);
      *ppvVar2 = pTVar5;
      std::bitset<256UL>::operator[]((bitset<256UL> *)local_80,(size_t)(local_48 + 1));
      std::bitset<256UL>::reference::operator=((reference *)local_80,true);
      std::bitset<256UL>::reference::~reference((reference *)local_80);
      pvVar3 = local_60;
      if (local_60 != (vector_block<unsigned_char_*,_128U> *)0x0) {
        vector_block<unsigned_char_*,_128U>::~vector_block(local_60);
        operator_delete(pvVar3);
      }
    }
    str = str + 1;
  } while( true );
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}